

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O3

Address * cfd::core::Address::GetPegoutAddress
                    (Address *__return_storage_ptr__,NetType_conflict type,Script *locking_script,
                    vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                    *network_parameters)

{
  bool bVar1;
  CfdException *pCVar2;
  ByteData hash;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> items;
  Script pegout_locking_script;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> list;
  string local_c0;
  ByteData local_a0;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_88;
  Script local_70;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_38;
  
  Script::GetElementList(&local_38,locking_script);
  bVar1 = Script::IsPegoutScript(locking_script);
  if ((bVar1) &&
     (2 < (ulong)(((long)local_38.
                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_38.
                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555))) {
    ScriptElement::GetBinaryData
              ((ByteData *)&local_c0,
               local_38.
               super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
               ._M_impl.super__Vector_impl_data._M_start + 2);
    Script::Script(&local_70,(ByteData *)&local_c0);
    if (local_c0._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    Script::GetElementList(&local_88,&local_70);
    bVar1 = Script::IsP2wpkhScript(&local_70);
    if (bVar1) {
      ScriptElement::GetBinaryData
                ((ByteData *)&local_c0,
                 local_88.
                 super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1);
      Address(__return_storage_ptr__,type,kVersion0,(ByteData *)&local_c0,network_parameters);
    }
    else {
      bVar1 = Script::IsTaprootScript(&local_70);
      if (bVar1) {
        ScriptElement::GetBinaryData
                  ((ByteData *)&local_c0,
                   local_88.
                   super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1);
        Address(__return_storage_ptr__,type,kVersion1,(ByteData *)&local_c0,network_parameters);
      }
      else {
        bVar1 = Script::IsP2pkhScript(&local_70);
        if (bVar1) {
          ScriptElement::GetBinaryData
                    (&local_a0,
                     local_88.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_start + 2);
          ByteData160::ByteData160((ByteData160 *)&local_c0,&local_a0);
          if (local_a0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a0.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          Address(__return_storage_ptr__,type,kP2pkhAddress,(ByteData160 *)&local_c0,
                  network_parameters);
        }
        else {
          bVar1 = Script::IsP2shScript(&local_70);
          if (!bVar1) {
            pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c0,
                       "Invalid pegout script. This script is unsupported by pegout address.","");
            CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_c0);
            __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
          }
          ScriptElement::GetBinaryData
                    (&local_a0,
                     local_88.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
          ByteData160::ByteData160((ByteData160 *)&local_c0,&local_a0);
          if (local_a0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a0.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          Address(__return_storage_ptr__,type,kP2shAddress,(ByteData160 *)&local_c0,
                  network_parameters);
        }
      }
    }
    if (local_c0._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              (&local_88);
    Script::~Script(&local_70);
    ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              (&local_38);
    return __return_storage_ptr__;
  }
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  local_70._vptr_Script =
       (_func_int **)
       ((long)&local_70.script_data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 8);
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"Invalid pegout script. This script have not a pegout address.","")
  ;
  CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&local_70);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Address Address::GetPegoutAddress(
    NetType type, const Script& locking_script,
    const std::vector<AddressFormatData>& network_parameters) {
  auto list = locking_script.GetElementList();
  if ((!locking_script.IsPegoutScript()) || (list.size() <= 2)) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid pegout script. This script have not a pegout address.");
  }

  Script pegout_locking_script = Script(list[2].GetBinaryData());
  auto items = pegout_locking_script.GetElementList();
  if (pegout_locking_script.IsP2wpkhScript()) {
    ByteData hash(items[1].GetBinaryData());
    return Address(type, WitnessVersion::kVersion0, hash, network_parameters);
  } else if (pegout_locking_script.IsTaprootScript()) {
    ByteData hash(items[1].GetBinaryData());
    return Address(type, WitnessVersion::kVersion1, hash, network_parameters);
  } else if (pegout_locking_script.IsP2pkhScript()) {
    ByteData160 hash(items[2].GetBinaryData());
    return Address(type, AddressType::kP2pkhAddress, hash, network_parameters);
  } else if (pegout_locking_script.IsP2shScript()) {
    ByteData160 hash(items[1].GetBinaryData());
    return Address(type, AddressType::kP2shAddress, hash, network_parameters);
  } else {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid pegout script. This script is unsupported by pegout "
        "address.");
  }
}